

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

unsigned_short __thiscall
math::wide_integer::uintwide_t::operator_cast_to_unsigned_short
          (uintwide_t<256U,_unsigned_short,_void,_true> *this)

{
  ushort *puVar1;
  short *psVar2;
  long lVar3;
  bool bVar4;
  uintwide_t<256U,_unsigned_short,_void,_true> tmp;
  
  if (-1 < (short)(this->values).super_array<unsigned_short,_16UL>.elems[0xf]) {
    return (this->values).super_array<unsigned_short,_16UL>.elems[0];
  }
  tmp.values.super_array<unsigned_short,_16UL>.elems._16_8_ =
       *(undefined8 *)((this->values).super_array<unsigned_short,_16UL>.elems + 8);
  tmp.values.super_array<unsigned_short,_16UL>.elems._24_8_ =
       *(undefined8 *)((this->values).super_array<unsigned_short,_16UL>.elems + 0xc);
  tmp.values.super_array<unsigned_short,_16UL>.elems._0_8_ =
       *(undefined8 *)(this->values).super_array<unsigned_short,_16UL>.elems;
  tmp.values.super_array<unsigned_short,_16UL>.elems._8_8_ =
       *(undefined8 *)((this->values).super_array<unsigned_short,_16UL>.elems + 4);
  lVar3 = 0;
  do {
    puVar1 = (ushort *)((long)tmp.values.super_array<unsigned_short,_16UL>.elems + lVar3);
    *puVar1 = ~*puVar1;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0x20);
  lVar3 = 0;
  do {
    psVar2 = (short *)((long)tmp.values.super_array<unsigned_short,_16UL>.elems + lVar3);
    *psVar2 = *psVar2 + 1;
    if (*psVar2 != 0) break;
    bVar4 = lVar3 != 0x1e;
    lVar3 = lVar3 + 2;
  } while (bVar4);
  return -tmp.values.super_array<unsigned_short,_16UL>.elems[0];
}

Assistant:

static constexpr auto is_neg(const uintwide_t<Width2, LimbType, AllocatorType, RePhraseIsSigned>& a, // NOLINT(hicpp-named-parameter,readability-named-parameter)
                                 std::enable_if_t<RePhraseIsSigned, int>* = nullptr) -> bool             // NOLINT(hicpp-named-parameter,readability-named-parameter)
    {
      return (static_cast<std::uint_fast8_t>(static_cast<std::uint_fast8_t>(a.values.back() >> static_cast<size_t>(std::numeric_limits<typename uintwide_t<Width2, LimbType, AllocatorType, RePhraseIsSigned>::limb_type>::digits - 1)) & 1U) != 0U);
    }